

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_string.c
# Opt level: O2

int dwarfstring_append_length(dwarfstring_s *g,char *str,size_t slen)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  
  if (slen != 0 && str != (char *)0x0) {
    sVar3 = g->s_size;
    uVar1 = g->s_avail;
    if ((uVar1 <= slen) && (iVar2 = dwarfstring_add_to(g,slen + sVar3 + 2), iVar2 == 0)) {
      return 0;
    }
    memcpy(g->s_data + (sVar3 - uVar1),str,slen);
    sVar3 = g->s_avail - slen;
    g->s_avail = sVar3;
    g->s_data[g->s_size - sVar3] = '\0';
  }
  return 1;
}

Assistant:

int
dwarfstring_append_length(struct dwarfstring_s *g,char *str,
    size_t slen)
{
    /*  lastpos is the length of characters
        without the null-terminator  we call it strlen */
    size_t lastpos = g->s_size - g->s_avail;
    int r          = 0;

    if (!str  || slen ==0) {
        return TRUE;
    }
    if (slen >= g->s_avail) {
        size_t newlen = 0;

        newlen = g->s_size + slen+2;
        r = dwarfstring_add_to(g,newlen);
        if (!r) {
            /* Unable to resize, dare not do anything. */
            return FALSE;
        }
    }
    memcpy(g->s_data + lastpos,str,slen);
    g->s_avail -= slen;
    /*  Adding string terminating null byte.
        Space is guaranteed available to do this.*/
    g->s_data[g->s_size - g->s_avail] = 0;
    return TRUE;
}